

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse_time.c
# Opt level: O1

time_t ngx_parse_http_time(u_char *value,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  time_t tVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint local_40;
  
  pbVar1 = value + len;
  if (0 < (long)len) {
    do {
      if (*value == 0x20) {
        bVar5 = true;
        goto LAB_001189a9;
      }
    } while ((*value != 0x2c) && (value = value + 1, value < pbVar1));
  }
  bVar5 = false;
LAB_001189a9:
  uVar11 = 0;
  do {
    uVar10 = uVar11;
    pbVar13 = value + uVar10 + 1;
    if (pbVar1 <= pbVar13) break;
    uVar11 = uVar10 + 1;
  } while (*pbVar13 == 0x20);
  tVar7 = -1;
  if (0x11 < (long)(pbVar1 + (~uVar10 - (long)value))) {
    if (bVar5) {
      iVar8 = 3;
      uVar11 = 0x20;
    }
    else {
      bVar2 = *pbVar13;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        return -1;
      }
      if ((byte)(value[uVar10 + 2] - 0x3a) < 0xf6) {
        return -1;
      }
      if (value[uVar10 + 3] == 0x2d) {
        iVar8 = 2;
      }
      else {
        if (value[uVar10 + 3] != 0x20) {
          return -1;
        }
        iVar8 = 1;
        if ((long)(pbVar1 + (-uVar10 - (long)value) + -3) < 0x12) {
          return -1;
        }
      }
      uVar11 = (ulong)((uint)value[uVar10 + 2] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210);
      pbVar13 = value + uVar10 + 4;
    }
    switch(*pbVar13) {
    case 0x41:
      uVar10 = (ulong)(pbVar13[1] != 0x70) * 4 + 3;
      break;
    default:
      goto switchD_00118a17_caseD_42;
    case 0x44:
      uVar10 = 0xb;
      break;
    case 0x46:
      uVar10 = 1;
      break;
    case 0x4a:
      if (pbVar13[1] == 0x61) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(pbVar13[2] != 0x6e) + 5;
      }
      break;
    case 0x4d:
      uVar10 = (ulong)(pbVar13[2] != 0x72) * 2 + 2;
      break;
    case 0x4e:
      uVar10 = 10;
      break;
    case 0x4f:
      uVar10 = 9;
      break;
    case 0x53:
      uVar10 = 8;
    }
    if (((iVar8 != 1) || (pbVar13[3] == 0x20)) && ((iVar8 != 2 || (pbVar13[3] == 0x2d)))) {
      pbVar14 = pbVar13 + 4;
      if (iVar8 == 1) {
        if ((byte)(*pbVar14 - 0x3a) < 0xf6) {
          return -1;
        }
        if ((byte)(pbVar13[5] - 0x3a) < 0xf6) {
          return -1;
        }
        bVar2 = pbVar13[6];
        if ((byte)(bVar2 - 0x3a) < 0xf6) {
          return -1;
        }
        if ((byte)(pbVar13[7] - 0x3a) < 0xf6) {
          return -1;
        }
        uVar9 = (ulong)(((uint)pbVar13[5] * 100 + (uint)*pbVar14 * 1000 +
                         ((uint)bVar2 + (uint)bVar2 * 4) * 2 + (uint)pbVar13[7]) - 0xd050);
        pbVar14 = pbVar13 + 8;
      }
      else {
        uVar9 = 0x7f6;
        if (iVar8 == 2) {
          bVar2 = *pbVar14;
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            return -1;
          }
          if ((byte)(pbVar13[5] - 0x3a) < 0xf6) {
            return -1;
          }
          uVar12 = (uint)pbVar13[5] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210;
          uVar9 = (ulong)uVar12 + 0x76c;
          if (uVar12 < 0x46) {
            uVar9 = (ulong)uVar12 + 2000;
          }
          pbVar14 = pbVar13 + 6;
        }
      }
      if (iVar8 == 3) {
        uVar15 = (ulong)(*pbVar14 == 0x20);
        if ((byte)(pbVar14[uVar15] - 0x3a) < 0xf6) {
          return -1;
        }
        uVar11 = (ulong)(pbVar14[uVar15] & 0xf);
        bVar2 = pbVar14[uVar15 + 1];
        if ((ulong)bVar2 == 0x20) {
          lVar6 = uVar15 + 1;
        }
        else {
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            return -1;
          }
          lVar6 = uVar15 + 2;
          uVar11 = ((ulong)bVar2 + uVar11 * 10) - 0x30;
        }
        pbVar14 = pbVar14 + lVar6;
        if ((long)pbVar1 - (long)pbVar14 < 0xe) {
          return -1;
        }
      }
      if ((((((*pbVar14 == 0x20) && (bVar2 = pbVar14[1], 0xf5 < (byte)(bVar2 - 0x3a))) &&
            (0xf5 < (byte)(pbVar14[2] - 0x3a))) &&
           ((pbVar14[3] == 0x3a && (bVar3 = pbVar14[4], 0xf5 < (byte)(bVar3 - 0x3a))))) &&
          ((0xf5 < (byte)(pbVar14[5] - 0x3a) &&
           ((pbVar14[6] == 0x3a && (bVar4 = pbVar14[7], 0xf5 < (byte)(bVar4 - 0x3a))))))) &&
         (0xf5 < (byte)(pbVar14[8] - 0x3a))) {
        if (iVar8 == 3) {
          if (pbVar14[9] != 0x20) {
            return -1;
          }
          if ((byte)(pbVar14[10] - 0x3a) < 0xf6) {
            return -1;
          }
          if ((byte)(pbVar14[0xb] - 0x3a) < 0xf6) {
            return -1;
          }
          if ((byte)(pbVar14[0xc] - 0x3a) < 0xf6) {
            return -1;
          }
          if ((byte)(pbVar14[0xd] - 0x3a) < 0xf6) {
            return -1;
          }
          local_40 = (uint)pbVar14[0xb];
          uVar9 = (ulong)(((uint)pbVar14[0xd] +
                          (uint)pbVar14[10] * 1000 + local_40 * 100 + (uint)pbVar14[0xc] * 10) -
                         0xd050);
        }
        uVar12 = (uint)pbVar14[2] + ((uint)bVar2 + (uint)bVar2 * 4) * 2 + -0x210;
        if (((uVar12 < 0x18) &&
            (uVar16 = (uint)pbVar14[5] + ((uint)bVar3 + (uint)bVar3 * 4) * 2 + -0x210, uVar16 < 0x3c
            )) && (uVar17 = (uint)pbVar14[8] + ((uint)bVar4 + (uint)bVar4 * 4) * 2 + -0x210,
                  uVar17 < 0x3c)) {
          if ((uVar11 == 0x1d) && ((int)uVar10 == 1)) {
            if ((uVar9 & 3) != 0) {
              return -1;
            }
            if (((uVar9 * -0x70a3d70a3d70a3d7 >> 2 | uVar9 * -0x70a3d70a3d70a3d7 << 0x3e) <
                 0x28f5c28f5c28f5d) && (uVar9 != (uVar9 / 400) * 400)) {
              return -1;
            }
          }
          else if (mday[uVar10] < uVar11) {
            return -1;
          }
          uVar9 = uVar9 - (uVar10 < 2);
          tVar7 = (ulong)uVar16 * 0x3c + (ulong)uVar12 * 0xe10 + (ulong)uVar17 + -0xe794e4080 +
                  (((uVar11 + (uVar9 >> 2) + uVar9 * 0x16d +
                    ((((ulong)(uVar10 < 2) - 1 | 0xb) + uVar10) * 0x16f) / 0xc) -
                   (uVar9 >> 2) / 0x19) + uVar9 / 400) * 0x15180;
        }
      }
    }
  }
switchD_00118a17_caseD_42:
  return tVar7;
}

Assistant:

time_t
ngx_parse_http_time(u_char *value, size_t len)
{
    u_char      *p, *end;
    ngx_int_t    month;
    ngx_uint_t   day, year, hour, min, sec;
    uint64_t     time;
    enum {
        no = 0,
        rfc822,   /* Tue, 10 Nov 2002 23:50:13   */
        rfc850,   /* Tuesday, 10-Dec-02 23:50:13 */
        isoc      /* Tue Dec 10 23:50:13 2002    */
    } fmt;

    fmt = 0;
    end = value + len;

#if (NGX_SUPPRESS_WARN)
    day = 32;
    year = 2038;
#endif

    for (p = value; p < end; p++) {
        if (*p == ',') {
            break;
        }

        if (*p == ' ') {
            fmt = isoc;
            break;
        }
    }

    for (p++; p < end; p++)
        if (*p != ' ') {
            break;
        }

    if (end - p < 18) {
        return NGX_ERROR;
        }

    if (fmt != isoc) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        day = (*p - '0') * 10 + *(p + 1) - '0';
        p += 2;

        if (*p == ' ') {
            if (end - p < 18) {
                return NGX_ERROR;
            }
            fmt = rfc822;

        } else if (*p == '-') {
            fmt = rfc850;

        } else {
            return NGX_ERROR;
        }

        p++;
    }

    switch (*p) {

    case 'J':
        month = *(p + 1) == 'a' ? 0 : *(p + 2) == 'n' ? 5 : 6;
        break;

    case 'F':
        month = 1;
        break;

    case 'M':
        month = *(p + 2) == 'r' ? 2 : 4;
        break;

    case 'A':
        month = *(p + 1) == 'p' ? 3 : 7;
        break;

    case 'S':
        month = 8;
        break;

    case 'O':
        month = 9;
        break;

    case 'N':
        month = 10;
        break;

    case 'D':
        month = 11;
        break;

    default:
        return NGX_ERROR;
    }

    p += 3;

    if ((fmt == rfc822 && *p != ' ') || (fmt == rfc850 && *p != '-')) {
        return NGX_ERROR;
    }

    p++;

    if (fmt == rfc822) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
        p += 4;

    } else if (fmt == rfc850) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        year = (*p - '0') * 10 + *(p + 1) - '0';
        year += (year < 70) ? 2000 : 1900;
        p += 2;
    }

    if (fmt == isoc) {
        if (*p == ' ') {
            p++;
        }

        if (*p < '0' || *p > '9') {
            return NGX_ERROR;
        }

        day = *p++ - '0';

        if (*p != ' ') {
            if (*p < '0' || *p > '9') {
                return NGX_ERROR;
            }

            day = day * 10 + *p++ - '0';
        }

        if (end - p < 14) {
            return NGX_ERROR;
        }
    }

    if (*p++ != ' ') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    hour = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    min = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    sec = (*p - '0') * 10 + *(p + 1) - '0';

    if (fmt == isoc) {
        p += 2;

        if (*p++ != ' ') {
            return NGX_ERROR;
        }

        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
    }

    if (hour > 23 || min > 59 || sec > 59) {
        return NGX_ERROR;
    }

    if (day == 29 && month == 1) {
        if ((year & 3) || ((year % 100 == 0) && (year % 400) != 0)) {
            return NGX_ERROR;
        }

    } else if (day > mday[month]) {
        return NGX_ERROR;
    }

    /*
     * shift new year to March 1 and start months from 1 (not 0),
     * it is needed for Gauss' formula
     */

    if (--month <= 0) {
        month += 12;
        year -= 1;
    }

    /* Gauss' formula for Gregorian days since March 1, 1 BC */

    time = (uint64_t) (
            /* days in years including leap years since March 1, 1 BC */

            365 * year + year / 4 - year / 100 + year / 400

            /* days before the month */

            + 367 * month / 12 - 30

            /* days before the day */

            + day - 1

            /*
             * 719527 days were between March 1, 1 BC and March 1, 1970,
             * 31 and 28 days were in January and February 1970
             */

            - 719527 + 31 + 28) * 86400 + hour * 3600 + min * 60 + sec;

#if (NGX_TIME_T_SIZE <= 4)

    if (time > 0x7fffffff) {
        return NGX_ERROR;
    }

#endif

    return (time_t) time;
}